

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

TestCaseGroup * deqp::gles31::Functional::createSeparateShaderTests(Context *ctx)

{
  TestParams params_00;
  undefined1 auVar1 [20];
  TestParams params_01;
  TestParams params_02;
  Context *pCVar2;
  _Alloc_hider this;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  uint uVar6;
  TestCaseGroup *this_00;
  TestNode *pTVar7;
  SeparateShaderTest *pSVar8;
  ostream *poVar9;
  size_t sVar10;
  const_iterator cVar11;
  TestNode *pTVar12;
  ulong uVar13;
  uint uVar14;
  VaryingInterpolation qual;
  deUint32 flags;
  VaryingInterpolation qual_00;
  char *pcVar15;
  bool *pbVar16;
  undefined8 in_R8;
  undefined8 in_R9;
  VaryingInterpolation VVar17;
  char *__end;
  long lVar18;
  bool bVar19;
  bool bVar20;
  string code;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen;
  TestParams params;
  ostringstream name;
  ostringstream desc;
  Random rnd;
  key_type local_470;
  string local_450;
  Context *local_430;
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  _Alloc_hider local_3f8;
  TestNode *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  TestNodeType TStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  pointer local_3c0;
  undefined2 local_3b8;
  undefined1 uStack_3b6;
  undefined1 uStack_3b5;
  undefined1 uStack_3b4;
  undefined2 uStack_3b3;
  undefined1 uStack_3b1;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined1 local_398 [2];
  bool bStack_396;
  bool bStack_395;
  bool bStack_394;
  bool bStack_393;
  bool bStack_392;
  undefined1 uStack_391;
  int iStack_390;
  DataType DStack_38c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_388 [6];
  ios_base local_328 [264];
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [6];
  ios_base local_1b0 [264];
  TestNode *local_a8;
  code *local_a0;
  undefined8 uStack_98;
  long local_90 [2];
  undefined4 local_80;
  undefined2 uStack_7c;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 local_60;
  undefined2 uStack_5c;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  deRandom local_40;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,ctx->m_testCtx,"separate_shader","Separate shader tests");
  (this_00->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021a35d0;
  this_00->m_context = ctx;
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,ctx->m_testCtx,"pipeline","Pipeline configuration tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)ctx;
  local_430 = ctx;
  local_3f8._M_p = (pointer)this_00;
  local_3f0 = pTVar7;
  tcu::TestNode::addChild((TestNode *)this_00,pTVar7);
  uVar14 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    if ((((uVar14 & 4) == 0) || ((uVar14 & 3) == 0)) || ((uVar14 & 3) == 3)) {
      bVar19 = 0xf < uVar14;
      if (bVar19) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"same_",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_220,"Identically named ",0x12);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"different_",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_220,"Differently named ",0x12);
      }
      bVar20 = (uVar14 & 8) != 0;
      if (bVar20) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"uniform_",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"uniforms, ",10);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"constant_",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,"constants, ",0xb);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      local_3b8 = 0;
      uStack_3b6 = 0;
      uStack_3b3 = 0;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      uStack_3a4 = 5;
      uStack_3a0 = 5;
      auVar1 = ZEXT820(CONCAT17(uStack_3b1,(uint7)CONCAT11(bVar19,bVar20) << 0x18));
      params_00.varyings.vtxInterp = VARYINGINTERPOLATION_LAST;
      params_00.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      params_00.initSingle = (bool)auVar1[0];
      params_00.switchVtx = (bool)auVar1[1];
      params_00.switchFrg = (bool)auVar1[2];
      params_00.useUniform = (bool)auVar1[3];
      params_00.useSameName = (bool)auVar1[4];
      params_00.useCreateHelper = (bool)auVar1[5];
      params_00.useProgramUniform = (bool)auVar1[6];
      params_00._7_1_ = auVar1[7];
      params_00.varyings.count = auVar1._8_4_;
      params_00.varyings.type = auVar1._12_4_;
      params_00.varyings.binding = auVar1._16_4_;
      uStack_3b5 = bVar20;
      uStack_3b4 = bVar19;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)local_3f0,(TestCaseGroup *)local_428,&local_450,
                 (string *)(ulong)(uVar14 & 7),(int)in_R8,(ParamFlags)in_R9,params_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_450._M_dataplus._M_p._4_4_,local_450._M_dataplus._M_p._0_4_) !=
          &local_450.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_450._M_dataplus._M_p._4_4_,local_450._M_dataplus._M_p._0_4_),
                        CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                                 local_450.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._0_8_ != &local_418) {
        operator_delete((void *)local_428._0_8_,(ulong)(local_418._M_allocated_capacity + 1));
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
    std::ios_base::~ios_base(local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    std::ios_base::~ios_base(local_328);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x20);
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar2 = local_430;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,local_430->m_testCtx,"program_uniform","ProgramUniform tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)local_3f8._M_p,pTVar7);
  uVar14 = 0;
  do {
    if (((uVar14 < 4) || ((uVar14 & 3) == 3)) || ((uVar14 & 3) == 0)) {
      _local_398 = (code *)aaStack_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,0x1b3c1e9,0x1b3c1e9);
      local_220._0_8_ = local_210;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,0x1b3c1e9,0x1b3c1e9);
      local_60 = 0x1000000;
      uStack_5c = 0;
      uStack_5a = 1;
      uStack_58 = 0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 5;
      uStack_48 = 5;
      auVar1 = ZEXT820(CONCAT17(uStack_59,0x1000001000000));
      params_01.varyings.vtxInterp = VARYINGINTERPOLATION_LAST;
      params_01.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      params_01.initSingle = (bool)auVar1[0];
      params_01.switchVtx = (bool)auVar1[1];
      params_01.switchFrg = (bool)auVar1[2];
      params_01.useUniform = (bool)auVar1[3];
      params_01.useSameName = (bool)auVar1[4];
      params_01.useCreateHelper = (bool)auVar1[5];
      params_01.useProgramUniform = (bool)auVar1[6];
      params_01._7_1_ = auVar1[7];
      params_01.varyings.count = auVar1._8_4_;
      params_01.varyings.type = auVar1._12_4_;
      params_01.varyings.binding = auVar1._16_4_;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar7,(TestCaseGroup *)local_398,(string *)local_220,
                 (string *)(ulong)uVar14,(int)in_R8,(ParamFlags)in_R9,params_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._0_8_ != local_210) {
        operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_398 != aaStack_388) {
        operator_delete(_local_398,
                        CONCAT44(aaStack_388[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_388[0]._M_allocated_capacity) + 1);
      }
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 8);
  pTVar7 = (TestNode *)operator_new(0x78);
  pCVar2 = local_430;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,local_430->m_testCtx,"create_shader_program",
             "CreateShaderProgram tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)local_3f8._M_p,pTVar7);
  uVar14 = 0;
  do {
    if (((uVar14 < 4) || ((uVar14 & 3) == 3)) || ((uVar14 & 3) == 0)) {
      _local_398 = (code *)aaStack_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,0x1b3c1e9,0x1b3c1e9);
      local_220._0_8_ = local_210;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,0x1b3c1e9,0x1b3c1e9);
      local_80 = 0;
      uStack_7c = 0x100;
      uStack_7a = 0;
      uStack_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0;
      uStack_6c = 5;
      uStack_68 = 5;
      auVar1 = ZEXT820(CONCAT17(uStack_79,0x10000000000));
      params_02.varyings.vtxInterp = VARYINGINTERPOLATION_LAST;
      params_02.varyings.frgInterp = VARYINGINTERPOLATION_LAST;
      params_02.initSingle = (bool)auVar1[0];
      params_02.switchVtx = (bool)auVar1[1];
      params_02.switchFrg = (bool)auVar1[2];
      params_02.useUniform = (bool)auVar1[3];
      params_02.useSameName = (bool)auVar1[4];
      params_02.useCreateHelper = (bool)auVar1[5];
      params_02.useProgramUniform = (bool)auVar1[6];
      params_02._7_1_ = auVar1[7];
      params_02.varyings.count = auVar1._8_4_;
      params_02.varyings.type = auVar1._12_4_;
      params_02.varyings.binding = auVar1._16_4_;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar7,(TestCaseGroup *)local_398,(string *)local_220,
                 (string *)(ulong)uVar14,(int)in_R8,(ParamFlags)in_R9,params_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._0_8_ != local_210) {
        operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_398 != aaStack_388) {
        operator_delete(_local_398,
                        CONCAT44(aaStack_388[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_388[0]._M_allocated_capacity) + 1);
      }
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 8);
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar2->m_testCtx,"interface",
             "Shader interface compatibility tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_3f0 = pTVar7;
  tcu::TestNode::addChild((TestNode *)local_3f8._M_p,pTVar7);
  VVar17 = VARYINGINTERPOLATION_SMOOTH;
  do {
    local_470._M_string_length = 0;
    local_470.field_2._M_allocated_capacity._0_4_ = 0;
    local_470._M_dataplus._M_p = local_470._M_dataplus._M_p & 0xff00000000000000;
    local_470.field_2._M_allocated_capacity._4_4_ = 5;
    local_470.field_2._8_4_ = 5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    qual_00 = VVar17 & VARYINGINTERPOLATION_DEFAULT;
    qual = VVar17 >> 2 & VARYINGINTERPOLATION_DEFAULT;
    local_470.field_2._M_allocated_capacity._0_4_ = VVar17 >> 4;
    local_470._M_string_length = (size_type)&DAT_100000001;
    local_470.field_2._M_allocated_capacity._4_4_ = qual;
    local_470.field_2._8_4_ = qual_00;
    if ((VVar17 >> 4 & 1) == 0) {
      lVar18 = 0x19;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"same_name",9);
      pcVar15 = "Varyings have same name, ";
    }
    else {
      lVar18 = 0x1d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_398,"same_location",0xd);
      pcVar15 = "Varyings have same location, ";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pcVar15,lVar18);
    local_428._0_8_ = &local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"vertex","");
    anon_unknown_0::describeInterpolation
              ((string *)local_428,qual,(ostringstream *)local_398,(ostringstream *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._0_8_ != &local_418) {
      operator_delete((void *)local_428._0_8_,(ulong)(local_418._M_allocated_capacity + 1));
    }
    local_428._0_8_ = &local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"fragment","");
    anon_unknown_0::describeInterpolation
              ((string *)local_428,qual_00,(ostringstream *)local_398,(ostringstream *)local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._0_8_ != &local_418) {
      operator_delete((void *)local_428._0_8_,(ulong)(local_418._M_allocated_capacity + 1));
    }
    bVar19 = anon_unknown_0::paramsValid((TestParams *)&local_470);
    if (bVar19) {
      pSVar8 = (SeparateShaderTest *)operator_new(0x180);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      local_a0 = anon_unknown_0::SeparateShaderTest::testPipelineRendering;
      uStack_98 = 0;
      anon_unknown_0::SeparateShaderTest::SeparateShaderTest
                (pSVar8,local_430,(string *)local_428,&local_450,4,(TestParams *)&local_470,
                 0x148e33e);
      tcu::TestNode::addChild(local_3f0,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_450._M_dataplus._M_p._4_4_,local_450._M_dataplus._M_p._0_4_) !=
          &local_450.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_450._M_dataplus._M_p._4_4_,local_450._M_dataplus._M_p._0_4_),
                        CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                                 local_450.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._0_8_ != &local_418) {
        operator_delete((void *)local_428._0_8_,(ulong)(local_418._M_allocated_capacity + 1));
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
    std::ios_base::~ios_base(local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    std::ios_base::~ios_base(local_328);
    pCVar2 = local_430;
    VVar17 = VVar17 + VARYINGINTERPOLATION_FLAT;
  } while (VVar17 != 0x20);
  iVar3 = tcu::CommandLine::getBaseSeed(local_430->m_testCtx->m_cmdLine);
  dVar4 = deStringHash("separate_shader.random");
  deRandom_init(&local_40,iVar3 + dVar4);
  local_418._8_8_ = local_428 + 8;
  local_428._8_4_ = _S_red;
  local_418._M_allocated_capacity = 0;
  local_408._8_8_ = 0;
  local_408._M_allocated_capacity = local_418._8_8_;
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar2->m_testCtx,"random",
             "Random pipeline configuration tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)local_3f8._M_p,pTVar7);
  local_3c0 = (pointer)0x0;
  local_a8 = pTVar7;
  do {
    local_3e8._8_4_ = 0;
    local_3e8._12_4_ = 0x5e;
    TStack_3d8 = NODETYPE_GROUP;
    uStack_3d4 = 5;
    uStack_3d0 = 5;
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    local_470._M_string_length = 0;
    local_470.field_2._M_allocated_capacity._0_4_ =
         local_470.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    iVar3 = 0x1000;
    do {
      local_3f0 = (TestNode *)CONCAT44(local_3f0._4_4_,iVar3);
      dVar4 = deRandom_getUint32(&local_40);
      deRandom_init((deRandom *)local_220,dVar4);
      iStack_390 = 0;
      DStack_38c = TYPE_LAST;
      aaStack_388[0]._M_allocated_capacity._0_4_ = NODETYPE_GROUP;
      aaStack_388[0]._M_allocated_capacity._4_4_ = 5;
      aaStack_388[0]._8_4_ = 5;
      uVar14 = 0;
      do {
        dVar5 = deRandom_getBool((deRandom *)local_220);
        local_398[0] = (ostringstream)(dVar5 == 1);
        dVar5 = deRandom_getBool((deRandom *)local_220);
        local_398[1] = dVar5 == 1;
        dVar5 = deRandom_getBool((deRandom *)local_220);
        bStack_396 = dVar5 == 1;
        dVar5 = deRandom_getBool((deRandom *)local_220);
        bStack_395 = dVar5 == 1;
        if (dVar5 == 1) {
          dVar5 = deRandom_getBool((deRandom *)local_220);
          bVar19 = dVar5 == 1;
        }
        else {
          bVar19 = false;
        }
        bStack_392 = bVar19;
        dVar5 = deRandom_getBool((deRandom *)local_220);
        bStack_393 = dVar5 == 1;
        dVar5 = deRandom_getBool((deRandom *)local_220);
        bStack_394 = dVar5 == 1;
        dVar4 = deRandom_getUint32((deRandom *)local_220);
        uVar6 = dVar4 % 5;
        DStack_38c = TYPE_LAST;
        if (uVar6 == 0) {
          DStack_38c = TYPE_INVALID;
        }
        aaStack_388[0]._4_4_ = (uVar6 == 0) + 4;
        iStack_390 = 1 << ((char)uVar6 - 1U & 0x1f);
        if (uVar6 == 0) {
          iStack_390 = 0;
        }
        aaStack_388[0]._M_allocated_capacity._0_4_ = NODETYPE_GROUP;
        aaStack_388[0]._8_4_ = aaStack_388[0]._4_4_;
        bVar19 = anon_unknown_0::paramsValid((TestParams *)local_398);
      } while ((!bVar19) && (bVar19 = uVar14 < 0xf, uVar14 = uVar14 + 1, bVar19));
      local_3e8._M_allocated_capacity = (size_type)_local_398;
      local_3e8._8_4_ = iStack_390;
      local_3e8._12_4_ = DStack_38c;
      TStack_3d8 = (undefined4)aaStack_388[0]._M_allocated_capacity;
      uStack_3d4 = aaStack_388[0]._M_allocated_capacity._4_4_;
      uStack_3d0 = aaStack_388[0]._8_4_;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
      pcVar15 = "2";
      if (local_3e8._M_local_buf[0] != '\0') {
        pcVar15 = "1";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pcVar15,1);
      uVar13 = local_3e8._M_allocated_capacity >> 8 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1b03b0f;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pbVar16,uVar13);
      uVar13 = local_3e8._M_allocated_capacity >> 0x10 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1b1a499;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pbVar16,uVar13);
      uVar13 = local_3e8._M_allocated_capacity >> 0x30 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1bec3e6;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pbVar16,uVar13);
      uVar13 = local_3e8._M_allocated_capacity >> 0x18 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1b23424;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pbVar16,uVar13);
      uVar13 = local_3e8._M_allocated_capacity >> 0x20 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1c6e00b;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pbVar16,uVar13);
      uVar13 = local_3e8._M_allocated_capacity >> 0x28 & 0xff;
      pbVar16 = glcts::fixed_sample_locations_values + 1;
      if (uVar13 != 0) {
        pbVar16 = (bool *)0x1b1a487;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_220,pbVar16,uVar13);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
      std::ostream::operator<<((TestParams *)local_398,local_3e8._8_4_);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
      std::ios_base::~ios_base(local_328);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_220,
                          (char *)CONCAT44(local_450._M_dataplus._M_p._4_4_,
                                           local_450._M_dataplus._M_p._0_4_),
                          local_450._M_string_length);
      pbVar16 = (bool *)0x1c7d652;
      if (TStack_3d8 != NODETYPE_ROOT) {
        if (TStack_3d8 == NODETYPE_PACKAGE) {
          pbVar16 = (bool *)0x1af666b;
        }
        else {
          pbVar16 = glcts::fixed_sample_locations_values + 1;
          if (TStack_3d8 == NODETYPE_GROUP) {
            pbVar16 = (bool *)0x1a6a6aa;
          }
        }
      }
      sVar10 = strlen(pbVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pbVar16,sVar10);
      if ((ulong)uStack_3d4 < 3) {
        pcVar15 = *(char **)(&DAT_021a94f8 + (ulong)uStack_3d4 * 8);
      }
      else {
        pcVar15 = "o";
        if (uStack_3d4 == 4) {
          pcVar15 = "r";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,1);
      if ((ulong)uStack_3d0 < 3) {
        pcVar15 = *(char **)(&DAT_021a94f8 + (ulong)uStack_3d0 * 8);
      }
      else {
        pcVar15 = "o";
        if (uStack_3d0 == 4) {
          pcVar15 = "r";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_450._M_dataplus._M_p._4_4_,local_450._M_dataplus._M_p._0_4_) !=
          &local_450.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_450._M_dataplus._M_p._4_4_,local_450._M_dataplus._M_p._0_4_),
                        CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                                 local_450.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
      std::ios_base::~ios_base(local_1b0);
      std::__cxx11::string::operator=((string *)&local_470,(string *)&local_a0);
      if (local_a0 != (code *)local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_428,&local_470);
    } while ((cVar11._M_node != (_Base_ptr)(local_428 + 8)) &&
            (iVar3 = (int)local_3f0 + -1, iVar3 != 0));
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_428,&local_470);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
    std::ostream::_M_insert<unsigned_long>((ulong)local_398);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    std::ios_base::~ios_base(local_328);
    pSVar8 = (SeparateShaderTest *)operator_new(0x180);
    _local_398 = anon_unknown_0::SeparateShaderTest::testPipelineRendering;
    iStack_390 = 0;
    DStack_38c = TYPE_INVALID;
    anon_unknown_0::SeparateShaderTest::SeparateShaderTest
              (pSVar8,local_430,(string *)local_220,(string *)local_220,4,(TestParams *)&local_3e8,
               0x148e33e);
    tcu::TestNode::addChild(local_a8,(TestNode *)pSVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._0_8_ != local_210) {
      operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,
                      CONCAT44(local_470.field_2._M_allocated_capacity._4_4_,
                               local_470.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_3c0 = (pointer)((long)local_3c0 + 1);
  } while (local_3c0 != (pointer)0x80);
  pTVar7 = (TestNode *)operator_new(0x78);
  this._M_p = local_3f8._M_p;
  pCVar2 = local_430;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,local_430->m_testCtx,"api","Program pipeline API tests");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this._M_p,pTVar7);
  local_450._M_string_length = 0;
  local_450.field_2._M_allocated_capacity._0_4_ = 0;
  local_450._M_dataplus._M_p._4_4_ = (uint)local_450._M_dataplus._M_p._7_1_ << 0x18;
  local_450.field_2._M_allocated_capacity._4_4_ = 5;
  local_450.field_2._8_4_ = 5;
  local_450._M_dataplus._M_p._0_4_ = 0x1000000;
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  _local_398 = (code *)aaStack_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"current_program_priority","")
  ;
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"Test priority between current program and pipeline binding","");
  local_470._M_dataplus._M_p = (pointer)anon_unknown_0::SeparateShaderTest::testCurrentProgPriority;
  local_470._M_string_length = 0;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,pCVar2,(string *)local_398,(string *)local_220,1,(TestParams *)&local_450,
             0x148eeaa);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_398 != aaStack_388) {
    operator_delete(_local_398,
                    CONCAT44(aaStack_388[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_388[0]._M_allocated_capacity) + 1);
  }
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  _local_398 = (code *)aaStack_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"active_program_uniform","");
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"Test that glUniform() affects a pipeline\'s active program","");
  local_470._M_dataplus._M_p = (pointer)anon_unknown_0::SeparateShaderTest::testActiveProgramUniform
  ;
  local_470._M_string_length = 0;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,pCVar2,(string *)local_398,(string *)local_220,1,(TestParams *)&local_450,
             0x148f31a);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_398 != aaStack_388) {
    operator_delete(_local_398,
                    CONCAT44(aaStack_388[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_388[0]._M_allocated_capacity) + 1);
  }
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  _local_398 = (code *)aaStack_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"pipeline_programs","");
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"Test queries for programs in program pipeline stages","");
  local_470._M_dataplus._M_p =
       (pointer)anon_unknown_0::SeparateShaderTest::testPipelineQueryPrograms;
  local_470._M_string_length = 0;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,pCVar2,(string *)local_398,(string *)local_220,1,(TestParams *)&local_450,
             0x148f84c);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_398 != aaStack_388) {
    operator_delete(_local_398,
                    CONCAT44(aaStack_388[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_388[0]._M_allocated_capacity) + 1);
  }
  pSVar8 = (SeparateShaderTest *)operator_new(0x180);
  _local_398 = (code *)aaStack_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"pipeline_active","");
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"Test query for active programs in a program pipeline","");
  local_470._M_dataplus._M_p = (pointer)anon_unknown_0::SeparateShaderTest::testPipelineQueryActive;
  local_470._M_string_length = 0;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar8,pCVar2,(string *)local_398,(string *)local_220,1,(TestParams *)&local_450,
             0x148fa8a);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_398 != aaStack_388) {
    operator_delete(_local_398,
                    CONCAT44(aaStack_388[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_388[0]._M_allocated_capacity) + 1);
  }
  pTVar7 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pCVar2->m_testCtx,"validation",
             "Negative program pipeline interface matching");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar7[1]._vptr_TestNode = (_func_int **)pCVar2;
  tcu::TestNode::addChild((TestNode *)this._M_p,pTVar7);
  pTVar12 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,pCVar2->m_testCtx,"es31",
             "GLSL ES 3.1 pipeline interface matching");
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar2;
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)local_398,pCVar2->m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo)
  ;
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_220,
             (ShaderLibrary *)local_398,"shaders/es31/separate_shader_validation.test");
  if (0 < (int)((ulong)(local_220._8_8_ - local_220._0_8_) >> 3)) {
    lVar18 = 0;
    do {
      tcu::TestNode::addChild(pTVar12,*(TestNode **)(local_220._0_8_ + lVar18 * 8));
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)((ulong)(local_220._8_8_ - local_220._0_8_) >> 3));
  }
  tcu::TestNode::addChild(pTVar7,pTVar12);
  pCVar2 = local_430;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity - local_220._0_8_);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_398);
  pTVar12 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,pCVar2->m_testCtx,"es32",
             "GLSL ES 3.2 pipeline interface matching");
  pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar12[1]._vptr_TestNode = (_func_int **)pCVar2;
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)local_398,pCVar2->m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo)
  ;
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_220,
             (ShaderLibrary *)local_398,"shaders/es32/separate_shader_validation.test");
  if (0 < (int)((ulong)(local_220._8_8_ - local_220._0_8_) >> 3)) {
    lVar18 = 0;
    do {
      tcu::TestNode::addChild(pTVar12,*(TestNode **)(local_220._0_8_ + lVar18 * 8));
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)((ulong)(local_220._8_8_ - local_220._0_8_) >> 3));
  }
  tcu::TestNode::addChild(pTVar7,pTVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity - local_220._0_8_);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_398);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_428);
  return (TestCaseGroup *)this._M_p;
}

Assistant:

TestCaseGroup* createSeparateShaderTests (Context& ctx)
{
	TestParams		defaultParams;
	int				numIterations	= 4;
	TestCaseGroup*	group			=
		new TestCaseGroup(ctx, "separate_shader", "Separate shader tests");

	defaultParams.useUniform			= false;
	defaultParams.initSingle			= false;
	defaultParams.switchVtx				= false;
	defaultParams.switchFrg				= false;
	defaultParams.useCreateHelper		= false;
	defaultParams.useProgramUniform		= false;
	defaultParams.useSameName			= false;
	defaultParams.varyings.count		= 0;
	defaultParams.varyings.type			= glu::TYPE_INVALID;
	defaultParams.varyings.binding		= BINDING_NAME;
	defaultParams.varyings.vtxInterp	= VARYINGINTERPOLATION_LAST;
	defaultParams.varyings.frgInterp	= VARYINGINTERPOLATION_LAST;

	TestCaseGroup* stagesGroup =
		new TestCaseGroup(ctx, "pipeline", "Pipeline configuration tests");
	group->addChild(stagesGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST << 2; ++flags)
	{
		TestParams		params			= defaultParams;
		ostringstream	name;
		ostringstream	desc;

		if (!areCaseParamFlagsValid(ParamFlags(flags & PARAMFLAGS_MASK)))
			continue;

		if (flags & (PARAMFLAGS_LAST << 1))
		{
			params.useSameName = true;
			name << "same_";
			desc << "Identically named ";
		}
		else
		{
			name << "different_";
			desc << "Differently named ";
		}

		if (flags & PARAMFLAGS_LAST)
		{
			params.useUniform = true;
			name << "uniform_";
			desc << "uniforms, ";
		}
		else
		{
			name << "constant_";
			desc << "constants, ";
		}

		addRenderTest(*stagesGroup, name.str(), desc.str(), numIterations,
					  ParamFlags(flags & PARAMFLAGS_MASK), params);
	}

	TestCaseGroup* programUniformGroup =
		new TestCaseGroup(ctx, "program_uniform", "ProgramUniform tests");
	group->addChild(programUniformGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useUniform = true;
		params.useProgramUniform = true;

		addRenderTest(*programUniformGroup, "", "", numIterations, ParamFlags(flags), params);
	}

	TestCaseGroup* createShaderProgramGroup =
		new TestCaseGroup(ctx, "create_shader_program", "CreateShaderProgram tests");
	group->addChild(createShaderProgramGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useCreateHelper = true;

		addRenderTest(*createShaderProgramGroup, "", "", numIterations,
					  ParamFlags(flags), params);
	}

	TestCaseGroup* interfaceGroup =
		new TestCaseGroup(ctx, "interface", "Shader interface compatibility tests");
	group->addChild(interfaceGroup);

	enum
	{
		NUM_INTERPOLATIONS	= VARYINGINTERPOLATION_RANDOM, // VARYINGINTERPOLATION_RANDOM is one after last fully specified interpolation
		INTERFACEFLAGS_LAST = BINDING_LAST * NUM_INTERPOLATIONS * NUM_INTERPOLATIONS
	};

	for (deUint32 flags = 0; flags < INTERFACEFLAGS_LAST; ++flags)
	{
		deUint32				tmpFlags	= flags;
		VaryingInterpolation	frgInterp	= VaryingInterpolation(tmpFlags % NUM_INTERPOLATIONS);
		VaryingInterpolation	vtxInterp	= VaryingInterpolation((tmpFlags /= NUM_INTERPOLATIONS)
																   % NUM_INTERPOLATIONS);
		BindingKind				binding		= BindingKind((tmpFlags /= NUM_INTERPOLATIONS)
														  % BINDING_LAST);
		TestParams				params		= defaultParams;
		ostringstream			name;
		ostringstream			desc;

		params.varyings.count		= 1;
		params.varyings.type		= glu::TYPE_FLOAT;
		params.varyings.binding		= binding;
		params.varyings.vtxInterp	= vtxInterp;
		params.varyings.frgInterp	= frgInterp;

		switch (binding)
		{
			case BINDING_LOCATION:
				name << "same_location";
				desc << "Varyings have same location, ";
				break;
			case BINDING_NAME:
				name << "same_name";
				desc << "Varyings have same name, ";
				break;
			default:
				DE_FATAL("Impossible");
		}

		describeInterpolation("vertex", vtxInterp, name, desc);
		describeInterpolation("fragment", frgInterp, name, desc);

		if (!paramsValid(params))
			continue;

		interfaceGroup->addChild(
			new SeparateShaderTest(ctx, name.str(), desc.str(), numIterations, params,
								   &SeparateShaderTest::testPipelineRendering));
	}

	deUint32		baseSeed	= ctx.getTestContext().getCommandLine().getBaseSeed();
	Random			rnd			(deStringHash("separate_shader.random") + baseSeed);
	set<string>		seen;
	TestCaseGroup*	randomGroup	= new TestCaseGroup(
		ctx, "random", "Random pipeline configuration tests");
	group->addChild(randomGroup);

	for (deUint32 i = 0; i < 128; ++i)
	{
		TestParams		params;
		string			code;
		deUint32		genIterations	= 4096;

		do
		{
			params	= genParams(rnd.getUint32());
			code	= paramsCode(params);
		} while (de::contains(seen, code) && --genIterations > 0);

		seen.insert(code);

		string name = de::toString(i); // Would be code but baseSeed can change

		randomGroup->addChild(new SeparateShaderTest(
								  ctx, name, name, numIterations, params,
								  &SeparateShaderTest::testPipelineRendering));
	}

	TestCaseGroup* apiGroup =
		new TestCaseGroup(ctx, "api", "Program pipeline API tests");
	group->addChild(apiGroup);

	{
		// More or less random parameters. These shouldn't have much effect, so just
		// do a single sample.
		TestParams params = defaultParams;
		params.useUniform = true;
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "current_program_priority",
								  "Test priority between current program and pipeline binding",
								  1, params, &SeparateShaderTest::testCurrentProgPriority));
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "active_program_uniform",
								  "Test that glUniform() affects a pipeline's active program",
								  1, params, &SeparateShaderTest::testActiveProgramUniform));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_programs",
								 "Test queries for programs in program pipeline stages",
								 1, params, &SeparateShaderTest::testPipelineQueryPrograms));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_active",
								 "Test query for active programs in a program pipeline",
								 1, params, &SeparateShaderTest::testPipelineQueryActive));
	}

	TestCaseGroup* interfaceMismatchGroup =
		new TestCaseGroup(ctx, "validation", "Negative program pipeline interface matching");
	group->addChild(interfaceMismatchGroup);

	{
		TestCaseGroup*						es31Group		= new TestCaseGroup(ctx, "es31", "GLSL ES 3.1 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es31Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es31Group);
	}

	{
		TestCaseGroup*						es32Group		= new TestCaseGroup(ctx, "es32", "GLSL ES 3.2 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es32Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es32Group);
	}

	return group;
}